

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

int SaveRAM(FILE *ff,int start,int length)

{
  int iVar1;
  CDeviceSlot *pCVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if ((DeviceID != (char *)0x0) && (0 < Device->SlotsCount)) {
    iVar4 = -1;
    if (length + start < 0x10001) {
      iVar4 = length;
    }
    iVar5 = 0x10000 - start;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    iVar4 = 0;
    do {
      pCVar2 = CDevice::GetSlot(Device,iVar4);
      iVar1 = pCVar2->Address;
      if ((iVar1 <= start) && (start < pCVar2->Size + iVar1)) {
        iVar6 = (iVar1 - start) + pCVar2->Size;
        if (iVar5 < iVar6) {
          iVar6 = iVar5;
        }
        sVar3 = fwrite(pCVar2->Page->RAM + (start - iVar1),1,(long)iVar6,(FILE *)ff);
        if (iVar6 != (int)sVar3) {
          return 0;
        }
        if (iVar5 - iVar6 == 0 || iVar5 < iVar6) {
          return 1;
        }
        start = iVar6 + start;
        iVar5 = iVar5 - iVar6;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < Device->SlotsCount);
  }
  return 0;
}

Assistant:

int SaveRAM(FILE* ff, int start, int length) {
	//unsigned int addadr = 0,save = 0;
	aint save = 0;
	if (!DeviceID) return 0;		// unreachable currently
	if (length + start > 0x10000) {
		length = -1;
	}
	if (length <= 0) {
		length = 0x10000 - start;
	}

	CDeviceSlot* S;
	for (int i=0;i<Device->SlotsCount;i++) {
		S = Device->GetSlot(i);
		if (start >= (int)S->Address  && start < (int)(S->Address + S->Size)) {
			if (length < (int)(S->Size - (start - S->Address))) {
				save = length;
			} else {
				save = S->Size - (start - S->Address);
			}
			if ((aint) fwrite(S->Page->RAM + (start - S->Address), 1, save, ff) != save) {
				return 0;
			}
			length -= save;
			start += save;
			if (length <= 0) {
				return 1;
			}
		}
	}
	return 0;		// unreachable (with current devices)
}